

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void paintSep(QPainter *p,QWidget *w,QRect *r,Orientation o,bool mouse_over)

{
  uint uVar1;
  QFlagsStorage<QStyle::StateFlag> QVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 auStack_50 [16];
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_78,0,0);
  uVar1 = ~w->data->widget_attributes & 1;
  uVar5 = uVar1 + 0x80;
  if (o == Horizontal) {
    uVar5 = uVar1;
  }
  QVar2.i = uVar5 + 0x2000;
  if ((int)CONCAT71(in_register_00000081,mouse_over) == 0) {
    QVar2.i = uVar5;
  }
  local_78._12_4_ = SUB84(local_78._8_8_,4);
  local_78._8_4_ =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorageHelper<QStyle::StateFlag,_4>)QVar2.i
  ;
  local_68._0_4_ = (r->x1).m_i;
  local_68._4_4_ = (r->y1).m_i;
  puStack_60._0_4_ = (r->x2).m_i;
  puStack_60._4_4_ = (r->y2).m_i;
  pQVar3 = QWidget::palette(w);
  QPalette::operator=((QPalette *)auStack_50,pQVar3);
  pQVar4 = QWidget::style(w);
  (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,0x1b,local_78,p,w);
  QStyleOption::~QStyleOption((QStyleOption *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void paintSep(QPainter *p, QWidget *w, const QRect &r, Qt::Orientation o, bool mouse_over)
{
    QStyleOption opt(0);
    opt.state = QStyle::State_None;
    if (w->isEnabled())
        opt.state |= QStyle::State_Enabled;
    if (o != Qt::Horizontal)
        opt.state |= QStyle::State_Horizontal;
    if (mouse_over)
        opt.state |= QStyle::State_MouseOver;
    opt.rect = r;
    opt.palette = w->palette();

    w->style()->drawPrimitive(QStyle::PE_IndicatorDockWidgetResizeHandle, &opt, p, w);
}